

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 (*pauVar1) [16];
  uint16_t *puVar2;
  __m128i *palVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  longlong lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  unkbyte10 Var14;
  unkbyte10 Var15;
  __m128i alVar16;
  __m128i alVar17;
  __m128i alVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ushort uVar25;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  undefined1 auVar26 [16];
  ushort uVar35;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar36;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar37 [16];
  short sVar44;
  ushort uVar45;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar46 [16];
  ushort uVar53;
  undefined1 auVar54 [16];
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar55 [16];
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  __m128i local_128;
  undefined1 local_118 [16];
  __m128i local_108;
  undefined1 local_f8 [16];
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  __m128i t80;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  __m128i thresh0;
  __m128i limit0;
  __m128i blimit0;
  __m128i local_78;
  undefined1 local_68 [16];
  __m128i p_1 [2];
  
  pauVar1 = (undefined1 (*) [16])(s + -(long)(p * 3));
  uVar4 = *(undefined8 *)*pauVar1;
  uVar5 = *(undefined8 *)(*pauVar1 + 8);
  auVar23 = *pauVar1;
  auVar22 = *pauVar1;
  lVar19 = (long)(p * 2);
  pauVar1 = (undefined1 (*) [16])(s + lVar19);
  uVar6 = *(undefined8 *)*pauVar1;
  uVar7 = *(undefined8 *)(*pauVar1 + 8);
  auVar28 = *pauVar1;
  auVar24 = *pauVar1;
  puVar2 = s + -lVar19;
  uVar8 = *(undefined8 *)puVar2;
  uVar9 = *(undefined8 *)(puVar2 + 4);
  Var14 = *(unkbyte10 *)puVar2;
  local_188 = (short)uVar8;
  sStack_186 = (short)((ulong)uVar8 >> 0x10);
  sStack_184 = (short)((ulong)uVar8 >> 0x20);
  sStack_182 = (short)((ulong)uVar8 >> 0x30);
  sStack_180 = (short)uVar9;
  sStack_17e = (short)((ulong)uVar9 >> 0x10);
  sStack_17c = (short)((ulong)uVar9 >> 0x20);
  sStack_17a = (short)((ulong)uVar9 >> 0x30);
  lVar20 = (long)p;
  palVar3 = (__m128i *)(s + -lVar20);
  lVar10 = (*palVar3)[0];
  lVar11 = (*palVar3)[1];
  alVar18 = *palVar3;
  alVar16 = *palVar3;
  uVar8 = *(undefined8 *)s;
  uVar9 = *(undefined8 *)(s + 4);
  auVar27 = *(undefined1 (*) [16])s;
  alVar17 = *(__m128i *)s;
  puVar2 = s + lVar20;
  uVar12 = *(undefined8 *)puVar2;
  uVar13 = *(undefined8 *)(puVar2 + 4);
  Var15 = *(unkbyte10 *)puVar2;
  local_178 = (short)uVar12;
  sStack_176 = (short)((ulong)uVar12 >> 0x10);
  sStack_174 = (short)((ulong)uVar12 >> 0x20);
  sStack_172 = (short)((ulong)uVar12 >> 0x30);
  sStack_170 = (short)uVar13;
  sStack_16e = (short)((ulong)uVar13 >> 0x10);
  sStack_16c = (short)((ulong)uVar13 >> 0x20);
  sStack_16a = (short)((ulong)uVar13 >> 0x30);
  get_limit_dual(_blimit0,_limit0,_thresh0,_blimit1,_limit1,_thresh1,bd,&blimit0,&limit0,&thresh0,
                 &t80);
  p_1[1][1]._2_2_ = sStack_17e;
  p_1[1]._0_10_ = Var14;
  p_1[1][1]._4_2_ = sStack_17c;
  p_1[1][1]._6_2_ = sStack_17a;
  auVar21 = psubusw(auVar22,(undefined1  [16])p_1[1]);
  auVar46 = psubusw((undefined1  [16])p_1[1],auVar22);
  auVar46 = auVar46 | auVar21;
  auVar22 = psubusw((undefined1  [16])p_1[1],(undefined1  [16])alVar16);
  auVar21 = psubusw((undefined1  [16])alVar16,(undefined1  [16])p_1[1]);
  auVar21 = auVar21 | auVar22;
  local_68._10_2_ = sStack_16e;
  local_68._0_10_ = Var15;
  local_68._12_2_ = sStack_16c;
  local_68._14_2_ = sStack_16a;
  auVar22 = psubusw(local_68,(undefined1  [16])alVar17);
  auVar26 = psubusw((undefined1  [16])alVar17,local_68);
  auVar26 = auVar26 | auVar22;
  sVar36 = auVar21._0_2_;
  sVar38 = auVar26._0_2_;
  local_e8 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._2_2_;
  sVar38 = auVar26._2_2_;
  uStack_e6 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._4_2_;
  sVar38 = auVar26._4_2_;
  uStack_e4 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._6_2_;
  sVar38 = auVar26._6_2_;
  uStack_e2 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._8_2_;
  sVar38 = auVar26._8_2_;
  uStack_e0 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._10_2_;
  sVar38 = auVar26._10_2_;
  uStack_de = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._12_2_;
  sVar38 = auVar26._12_2_;
  sVar39 = auVar26._14_2_;
  uStack_dc = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar21._14_2_;
  uStack_da = (ushort)(sVar39 < sVar36) * sVar36 | (ushort)(sVar39 >= sVar36) * sVar39;
  auVar21 = psubusw(auVar24,local_68);
  auVar22 = psubusw(local_68,auVar24);
  auVar22 = auVar22 | auVar21;
  auVar24 = psubusw((undefined1  [16])alVar16,(undefined1  [16])alVar17);
  auVar26 = psubusw((undefined1  [16])alVar17,(undefined1  [16])alVar16);
  auVar21 = psubusw((undefined1  [16])p_1[1],local_68);
  auVar37 = psubusw(local_68,(undefined1  [16])p_1[1]);
  auVar37 = auVar37 | auVar21;
  auVar24 = paddusw(auVar26 | auVar24,auVar26 | auVar24);
  auVar21._0_2_ = auVar37._0_2_ >> 1;
  auVar21._2_2_ = auVar37._2_2_ >> 1;
  auVar21._4_2_ = auVar37._4_2_ >> 1;
  auVar21._6_2_ = auVar37._6_2_ >> 1;
  auVar21._8_2_ = auVar37._8_2_ >> 1;
  auVar21._10_2_ = auVar37._10_2_ >> 1;
  auVar21._12_2_ = auVar37._12_2_ >> 1;
  auVar21._14_2_ = auVar37._14_2_ >> 1;
  auVar21 = paddusw(auVar21,auVar24);
  auVar21 = auVar21 ^ _DAT_00434980;
  auVar24 = _DAT_00434980 ^ (undefined1  [16])blimit0;
  auVar26._0_2_ = -(ushort)(auVar24._0_2_ < auVar21._0_2_);
  auVar26._2_2_ = -(ushort)(auVar24._2_2_ < auVar21._2_2_);
  auVar26._4_2_ = -(ushort)(auVar24._4_2_ < auVar21._4_2_);
  auVar26._6_2_ = -(ushort)(auVar24._6_2_ < auVar21._6_2_);
  auVar26._8_2_ = -(ushort)(auVar24._8_2_ < auVar21._8_2_);
  auVar26._10_2_ = -(ushort)(auVar24._10_2_ < auVar21._10_2_);
  auVar26._12_2_ = -(ushort)(auVar24._12_2_ < auVar21._12_2_);
  auVar26._14_2_ = -(ushort)(auVar24._14_2_ < auVar21._14_2_);
  auVar24 = paddusw((undefined1  [16])limit0,_DAT_0046e8b0);
  auVar24 = auVar24 & auVar26;
  sVar36 = auVar22._0_2_;
  sVar38 = auVar24._0_2_;
  uVar25 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._2_2_;
  sVar38 = auVar24._2_2_;
  uVar29 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._4_2_;
  sVar38 = auVar24._4_2_;
  uVar30 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._6_2_;
  sVar38 = auVar24._6_2_;
  uVar31 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._8_2_;
  sVar38 = auVar24._8_2_;
  uVar32 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._10_2_;
  sVar38 = auVar24._10_2_;
  uVar33 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._12_2_;
  sVar38 = auVar24._12_2_;
  sVar39 = auVar24._14_2_;
  uVar34 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar22._14_2_;
  uVar35 = (ushort)(sVar39 < sVar36) * sVar36 | (ushort)(sVar39 >= sVar36) * sVar39;
  sVar36 = auVar46._0_2_;
  uVar45 = (sVar36 < (short)local_e8) * local_e8 | (ushort)(sVar36 >= (short)local_e8) * sVar36;
  sVar36 = auVar46._2_2_;
  uVar47 = (sVar36 < (short)uStack_e6) * uStack_e6 | (ushort)(sVar36 >= (short)uStack_e6) * sVar36;
  sVar36 = auVar46._4_2_;
  uVar48 = (sVar36 < (short)uStack_e4) * uStack_e4 | (ushort)(sVar36 >= (short)uStack_e4) * sVar36;
  sVar36 = auVar46._6_2_;
  uVar49 = (sVar36 < (short)uStack_e2) * uStack_e2 | (ushort)(sVar36 >= (short)uStack_e2) * sVar36;
  sVar36 = auVar46._8_2_;
  uVar50 = (sVar36 < (short)uStack_e0) * uStack_e0 | (ushort)(sVar36 >= (short)uStack_e0) * sVar36;
  sVar36 = auVar46._10_2_;
  uVar51 = (sVar36 < (short)uStack_de) * uStack_de | (ushort)(sVar36 >= (short)uStack_de) * sVar36;
  sVar36 = auVar46._12_2_;
  sVar38 = auVar46._14_2_;
  uVar52 = (sVar36 < (short)uStack_dc) * uStack_dc | (ushort)(sVar36 >= (short)uStack_dc) * sVar36;
  uVar53 = (sVar38 < (short)uStack_da) * uStack_da | (ushort)(sVar38 >= (short)uStack_da) * sVar38;
  auVar37._0_2_ =
       ((short)uVar45 < (short)uVar25) * uVar25 | ((short)uVar45 >= (short)uVar25) * uVar45;
  auVar37._2_2_ =
       ((short)uVar47 < (short)uVar29) * uVar29 | ((short)uVar47 >= (short)uVar29) * uVar47;
  auVar37._4_2_ =
       ((short)uVar48 < (short)uVar30) * uVar30 | ((short)uVar48 >= (short)uVar30) * uVar48;
  auVar37._6_2_ =
       ((short)uVar49 < (short)uVar31) * uVar31 | ((short)uVar49 >= (short)uVar31) * uVar49;
  auVar37._8_2_ =
       ((short)uVar50 < (short)uVar32) * uVar32 | ((short)uVar50 >= (short)uVar32) * uVar50;
  auVar37._10_2_ =
       ((short)uVar51 < (short)uVar33) * uVar33 | ((short)uVar51 >= (short)uVar33) * uVar51;
  auVar37._12_2_ =
       ((short)uVar52 < (short)uVar34) * uVar34 | ((short)uVar52 >= (short)uVar34) * uVar52;
  auVar37._14_2_ =
       ((short)uVar53 < (short)uVar35) * uVar35 | ((short)uVar53 >= (short)uVar35) * uVar53;
  auVar22 = psubusw(auVar37,(undefined1  [16])limit0);
  local_d8 = -(ushort)(auVar22._0_2_ == 0);
  sStack_d6 = -(ushort)(auVar22._2_2_ == 0);
  sStack_d4 = -(ushort)(auVar22._4_2_ == 0);
  sStack_d2 = -(ushort)(auVar22._6_2_ == 0);
  sStack_d0 = -(ushort)(auVar22._8_2_ == 0);
  sStack_ce = -(ushort)(auVar22._10_2_ == 0);
  sStack_cc = -(ushort)(auVar22._12_2_ == 0);
  sStack_ca = -(ushort)(auVar22._14_2_ == 0);
  local_b8 = local_d8;
  sStack_b6 = sStack_d6;
  sStack_b4 = sStack_d4;
  sStack_b2 = sStack_d2;
  sStack_b0 = sStack_d0;
  sStack_ae = sStack_ce;
  sStack_ac = sStack_cc;
  sStack_aa = sStack_ca;
  local_78 = alVar17;
  p_1[0] = alVar16;
  highbd_filter4_dual_sse2
            (p_1,&local_78,&local_108,&local_128,(__m128i *)&local_b8,&thresh0,bd,&t80);
  auVar22 = psubusw(auVar28,auVar27);
  auVar24 = psubusw(auVar27,auVar28);
  auVar24 = auVar24 | auVar22;
  auVar27 = psubusw(auVar23,(undefined1  [16])alVar18);
  auVar22 = psubusw((undefined1  [16])alVar18,auVar23);
  auVar22 = auVar22 | auVar27;
  sVar36 = auVar24._0_2_;
  sVar38 = auVar22._0_2_;
  uVar25 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._2_2_;
  sVar38 = auVar22._2_2_;
  uVar29 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._4_2_;
  sVar38 = auVar22._4_2_;
  uVar30 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._6_2_;
  sVar38 = auVar22._6_2_;
  uVar31 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._8_2_;
  sVar38 = auVar22._8_2_;
  uVar32 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._10_2_;
  sVar38 = auVar22._10_2_;
  uVar33 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._12_2_;
  sVar38 = auVar22._12_2_;
  sVar39 = auVar22._14_2_;
  uVar34 = (ushort)(sVar38 < sVar36) * sVar36 | (ushort)(sVar38 >= sVar36) * sVar38;
  sVar36 = auVar24._14_2_;
  uVar35 = (ushort)(sVar39 < sVar36) * sVar36 | (ushort)(sVar39 >= sVar36) * sVar39;
  auVar24._0_2_ =
       ((short)uVar25 < (short)local_e8) * local_e8 | ((short)uVar25 >= (short)local_e8) * uVar25;
  auVar24._2_2_ =
       ((short)uVar29 < (short)uStack_e6) * uStack_e6 | ((short)uVar29 >= (short)uStack_e6) * uVar29
  ;
  auVar24._4_2_ =
       ((short)uVar30 < (short)uStack_e4) * uStack_e4 | ((short)uVar30 >= (short)uStack_e4) * uVar30
  ;
  auVar24._6_2_ =
       ((short)uVar31 < (short)uStack_e2) * uStack_e2 | ((short)uVar31 >= (short)uStack_e2) * uVar31
  ;
  auVar24._8_2_ =
       ((short)uVar32 < (short)uStack_e0) * uStack_e0 | ((short)uVar32 >= (short)uStack_e0) * uVar32
  ;
  auVar24._10_2_ =
       ((short)uVar33 < (short)uStack_de) * uStack_de | ((short)uVar33 >= (short)uStack_de) * uVar33
  ;
  auVar24._12_2_ =
       ((short)uVar34 < (short)uStack_dc) * uStack_dc | ((short)uVar34 >= (short)uStack_dc) * uVar34
  ;
  auVar24._14_2_ =
       ((short)uVar35 < (short)uStack_da) * uStack_da | ((short)uVar35 >= (short)uStack_da) * uVar35
  ;
  auVar22 = psllw(_DAT_0046e8b0,ZEXT416(bd - 8));
  auVar22 = psubusw(auVar24,auVar22);
  auVar23._0_2_ = -(ushort)(auVar22._0_2_ == 0);
  auVar23._2_2_ = -(ushort)(auVar22._2_2_ == 0);
  auVar23._4_2_ = -(ushort)(auVar22._4_2_ == 0);
  auVar23._6_2_ = -(ushort)(auVar22._6_2_ == 0);
  auVar23._8_2_ = -(ushort)(auVar22._8_2_ == 0);
  auVar23._10_2_ = -(ushort)(auVar22._10_2_ == 0);
  auVar23._12_2_ = -(ushort)(auVar22._12_2_ == 0);
  auVar23._14_2_ = -(ushort)(auVar22._14_2_ == 0);
  auVar22._2_2_ = sStack_d6;
  auVar22._0_2_ = local_d8;
  auVar22._4_2_ = sStack_d4;
  auVar22._6_2_ = sStack_d2;
  auVar22._8_2_ = sStack_d0;
  auVar22._10_2_ = sStack_ce;
  auVar22._12_2_ = sStack_cc;
  auVar22._14_2_ = sStack_ca;
  auVar23 = auVar23 & auVar22;
  if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar23 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar23 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar23 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar23[0xf] < '\0') {
    auVar28._8_4_ = 0xffffffff;
    auVar28._0_8_ = 0xffffffffffffffff;
    auVar28._12_4_ = 0xffffffff;
    auVar28 = auVar28 ^ auVar23;
    sVar70 = (short)lVar10 + local_188;
    sVar71 = (short)((ulong)lVar10 >> 0x10) + sStack_186;
    sVar72 = (short)((ulong)lVar10 >> 0x20) + sStack_184;
    sVar73 = (short)((ulong)lVar10 >> 0x30) + sStack_182;
    sVar74 = (short)lVar11 + sStack_180;
    sVar75 = (short)((ulong)lVar11 >> 0x10) + sStack_17e;
    sVar76 = (short)((ulong)lVar11 >> 0x20) + sStack_17c;
    sVar77 = (short)((ulong)lVar11 >> 0x30) + sStack_17a;
    sVar62 = (short)uVar4;
    sVar63 = (short)((ulong)uVar4 >> 0x10);
    sVar64 = (short)((ulong)uVar4 >> 0x20);
    sVar65 = (short)((ulong)uVar4 >> 0x30);
    sVar66 = (short)uVar5;
    sVar67 = (short)((ulong)uVar5 >> 0x10);
    sVar68 = (short)((ulong)uVar5 >> 0x20);
    sVar69 = (short)((ulong)uVar5 >> 0x30);
    sVar36 = sVar70 * 2 + sVar62 + 4;
    sVar38 = sVar71 * 2 + sVar63 + 4;
    sVar39 = sVar72 * 2 + sVar64 + 4;
    sVar40 = sVar73 * 2 + sVar65 + 4;
    sVar41 = sVar74 * 2 + sVar66 + 4;
    sVar42 = sVar75 * 2 + sVar67 + 4;
    sVar43 = sVar76 * 2 + sVar68 + 4;
    sVar44 = sVar77 * 2 + sVar69 + 4;
    sVar56 = (short)((ulong)uVar8 >> 0x10);
    sVar57 = (short)((ulong)uVar8 >> 0x20);
    sVar58 = (short)((ulong)uVar8 >> 0x30);
    sVar59 = (short)((ulong)uVar9 >> 0x10);
    sVar60 = (short)((ulong)uVar9 >> 0x20);
    sVar61 = (short)((ulong)uVar9 >> 0x30);
    auVar27._0_2_ = (ushort)(sVar62 * 2 + (short)uVar8 + sVar36) >> 3;
    auVar27._2_2_ = (ushort)(sVar63 * 2 + sVar56 + sVar38) >> 3;
    auVar27._4_2_ = (ushort)(sVar64 * 2 + sVar57 + sVar39) >> 3;
    auVar27._6_2_ = (ushort)(sVar65 * 2 + sVar58 + sVar40) >> 3;
    auVar27._8_2_ = (ushort)(sVar66 * 2 + (short)uVar9 + sVar41) >> 3;
    auVar27._10_2_ = (ushort)(sVar67 * 2 + sVar59 + sVar42) >> 3;
    auVar27._12_2_ = (ushort)(sVar68 * 2 + sVar60 + sVar43) >> 3;
    auVar27._14_2_ = (ushort)(sVar69 * 2 + sVar61 + sVar44) >> 3;
    uVar45 = (short)uVar8 * 2 + local_178 + sVar36;
    uVar47 = sVar56 * 2 + sStack_176 + sVar38;
    uVar48 = sVar57 * 2 + sStack_174 + sVar39;
    uVar49 = sVar58 * 2 + sStack_172 + sVar40;
    uVar50 = (short)uVar9 * 2 + sStack_170 + sVar41;
    uVar51 = sVar59 * 2 + sStack_16e + sVar42;
    uVar52 = sVar60 * 2 + sStack_16c + sVar43;
    uVar53 = sVar61 * 2 + sStack_16a + sVar44;
    sVar36 = (short)((ulong)uVar6 >> 0x10);
    sVar38 = (short)((ulong)uVar6 >> 0x20);
    sVar39 = (short)((ulong)uVar6 >> 0x30);
    sVar40 = (short)((ulong)uVar7 >> 0x10);
    sVar41 = (short)((ulong)uVar7 >> 0x20);
    sVar42 = (short)((ulong)uVar7 >> 0x30);
    uVar25 = (local_178 - (sVar62 + local_188)) + (short)uVar6 + uVar45;
    uVar29 = (sStack_176 - (sVar63 + sStack_186)) + sVar36 + uVar47;
    uVar30 = (sStack_174 - (sVar64 + sStack_184)) + sVar38 + uVar48;
    uVar31 = (sStack_172 - (sVar65 + sStack_182)) + sVar39 + uVar49;
    uVar32 = (sStack_170 - (sVar66 + sStack_180)) + (short)uVar7 + uVar50;
    uVar33 = (sStack_16e - (sVar67 + sStack_17e)) + sVar40 + uVar51;
    uVar34 = (sStack_16c - (sVar68 + sStack_17c)) + sVar41 + uVar52;
    uVar35 = (sStack_16a - (sVar69 + sStack_17a)) + sVar42 + uVar53;
    auVar55._0_2_ = uVar45 >> 3;
    auVar55._2_2_ = uVar47 >> 3;
    auVar55._4_2_ = uVar48 >> 3;
    auVar55._6_2_ = uVar49 >> 3;
    auVar55._8_2_ = uVar50 >> 3;
    auVar55._10_2_ = uVar51 >> 3;
    auVar55._12_2_ = uVar52 >> 3;
    auVar55._14_2_ = uVar53 >> 3;
    auVar54._0_2_ = uVar25 >> 3;
    auVar54._2_2_ = uVar29 >> 3;
    auVar54._4_2_ = uVar30 >> 3;
    auVar54._6_2_ = uVar31 >> 3;
    auVar54._8_2_ = uVar32 >> 3;
    auVar54._10_2_ = uVar33 >> 3;
    auVar54._12_2_ = uVar34 >> 3;
    auVar54._14_2_ = uVar35 >> 3;
    auVar46._0_2_ = (ushort)(((short)uVar6 * 2 - sVar70) + uVar25) >> 3;
    auVar46._2_2_ = (ushort)((sVar36 * 2 - sVar71) + uVar29) >> 3;
    auVar46._4_2_ = (ushort)((sVar38 * 2 - sVar72) + uVar30) >> 3;
    auVar46._6_2_ = (ushort)((sVar39 * 2 - sVar73) + uVar31) >> 3;
    auVar46._8_2_ = (ushort)(((short)uVar7 * 2 - sVar74) + uVar32) >> 3;
    auVar46._10_2_ = (ushort)((sVar40 * 2 - sVar75) + uVar33) >> 3;
    auVar46._12_2_ = (ushort)((sVar41 * 2 - sVar76) + uVar34) >> 3;
    auVar46._14_2_ = (ushort)((sVar42 * 2 - sVar77) + uVar35) >> 3;
    local_128 = (__m128i)(auVar54 & auVar23 | (undefined1  [16])local_128 & auVar28);
    local_118 = auVar46 & auVar23 | local_118 & auVar28;
    local_108 = (__m128i)(auVar55 & auVar23 | (undefined1  [16])local_108 & auVar28);
    local_f8 = auVar27 & auVar23 | auVar28 & local_f8;
  }
  *(undefined1 (*) [16])(s + -lVar19) = local_f8;
  *(__m128i *)(s + -lVar20) = local_108;
  *(__m128i *)s = local_128;
  *(undefined1 (*) [16])(s + lVar20) = local_118;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p2, p1, p0, q0, q1, q2;

  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s + 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
  _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
  _mm_storeu_si128((__m128i *)(s + 0 * p), q0);
  _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
}